

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieloader.cpp
# Opt level: O1

void __thiscall ModelCache::configureCacheSize(ModelCache *this,size_t cacheSize)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mMutex);
  if (iVar1 == 0) {
    this->mcacheSize = cacheSize;
    if (cacheSize == 0) {
      std::__detail::
      _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<rlottie::internal::model::Composition>_>,_true>_>_>
      ::_M_deallocate_nodes
                ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<rlottie::internal::model::Composition>_>,_true>_>_>
                  *)this,(__node_ptr)(this->mHash)._M_h._M_before_begin._M_nxt);
      memset((this->mHash)._M_h._M_buckets,0,(this->mHash)._M_h._M_bucket_count << 3);
      (this->mHash)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (this->mHash)._M_h._M_element_count = 0;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mMutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void configureCacheSize(size_t cacheSize)
    {
        std::lock_guard<std::mutex> guard(mMutex);
        mcacheSize = cacheSize;

        if (!mcacheSize) mHash.clear();
    }